

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

uint32_t __thiscall
basisu::bitwise_coder::put_vlc(bitwise_coder *this,uint32_t v,uint32_t chunk_bits)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  int in_EDX;
  uint in_ESI;
  bitwise_coder *in_RDI;
  uint32_t next_v;
  uint32_t total_bits;
  uint32_t chunk_mask;
  uint32_t chunk_size;
  uint32_t local_1c;
  uint local_c;
  
  if (in_EDX == 0) {
    __assert_fail("chunk_bits",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                  ,0x97a,"uint32_t basisu::bitwise_coder::put_vlc(uint32_t, uint32_t)");
  }
  uVar1 = 1 << ((byte)in_EDX & 0x1f);
  local_1c = 0;
  local_c = in_ESI;
  do {
    uVar2 = local_c >> ((byte)in_EDX & 0x1f);
    uVar3 = uVar1;
    if (uVar2 == 0) {
      uVar3 = 0;
    }
    uVar3 = put_bits(in_RDI,local_c & uVar1 - 1,uVar3);
    local_1c = uVar3 + local_1c;
    local_c = uVar2;
  } while (uVar2 != 0);
  return local_1c;
}

Assistant:

inline uint32_t put_vlc(uint32_t v, uint32_t chunk_bits)
		{
			assert(chunk_bits);

			const uint32_t chunk_size = 1 << chunk_bits;
			const uint32_t chunk_mask = chunk_size - 1;
					
			uint32_t total_bits = 0;

			for ( ; ; )
			{
				uint32_t next_v = v >> chunk_bits;
								
				total_bits += put_bits((v & chunk_mask) | (next_v ? chunk_size : 0), chunk_bits + 1);
				if (!next_v)
					break;

				v = next_v;
			}

			return total_bits;
		}